

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O3

int run_test_we_get_signal(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uv_loop_t *puVar4;
  long lVar5;
  int iVar6;
  undefined4 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  ulong uVar7;
  undefined4 uVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong *puVar11;
  signal_ctx *ctx;
  timer_ctx *ptVar12;
  int64_t eval_b;
  int64_t eval_a;
  timer_ctx tc;
  signal_ctx sc;
  ulong uStack_930;
  timer_ctx tStack_928;
  signal_ctx sStack_8a0;
  signal_ctx sStack_818;
  signal_ctx sStack_790;
  signal_ctx sStack_708;
  uv_loop_t *puStack_678;
  ulong uStack_628;
  ulong uStack_620;
  timer_ctx tStack_618;
  signal_ctx sStack_590;
  uv_loop_t *puStack_508;
  timer_ctx *ptStack_500;
  ulong uStack_4f8;
  ulong uStack_4f0;
  signal_ctx sStack_4e8;
  signal_ctx sStack_460;
  signal_ctx sStack_3d8;
  signal_ctx sStack_350;
  timer_ctx tStack_2c8;
  timer_ctx tStack_240;
  ulong uStack_1b8;
  undefined8 *puStack_1b0;
  code *pcStack_1a8;
  long lStack_198;
  code *pcStack_190;
  undefined8 uStack_180;
  long lStack_178;
  undefined4 *puStack_170;
  signal_ctx *psStack_168;
  undefined8 uStack_150;
  long lStack_148;
  uv_loop_t *puStack_140;
  ulong local_130;
  ulong local_128;
  timer_ctx local_120;
  signal_ctx local_98;
  
  puStack_140 = (uv_loop_t *)0x1bd13d;
  puVar4 = (uv_loop_t *)uv_default_loop();
  puStack_140 = (uv_loop_t *)0x1bd152;
  start_timer(puVar4,0x11,&local_120);
  ctx = &local_98;
  iVar6 = 0;
  puStack_140 = (uv_loop_t *)0x1bd16c;
  start_watcher(puVar4,0x11,ctx,0);
  local_98.stop_or_close = STOP;
  puStack_140 = (uv_loop_t *)0x1bd17d;
  iVar3 = uv_run(puVar4,0);
  local_128 = (ulong)iVar3;
  local_130 = 0;
  if (local_128 == 0) {
    local_128 = (ulong)local_120.ncalls;
    local_130 = 10;
    if (local_128 != 10) goto LAB_001bd36a;
    local_128 = (ulong)local_98.ncalls;
    local_130 = 10;
    if (local_128 != 10) goto LAB_001bd379;
    puStack_140 = (uv_loop_t *)0x1bd1f6;
    start_timer(puVar4,0x11,&local_120);
    puStack_140 = (uv_loop_t *)0x1bd200;
    iVar3 = uv_run(puVar4,0);
    local_128 = (ulong)iVar3;
    local_130 = 0;
    if (local_128 != 0) goto LAB_001bd388;
    local_128 = (ulong)local_120.ncalls;
    local_130 = 10;
    if (local_128 != 10) goto LAB_001bd397;
    local_128 = (ulong)local_98.ncalls;
    local_130 = 10;
    if (local_128 != 10) goto LAB_001bd3a6;
    ctx = (signal_ctx *)0x0;
    local_98.stop_or_close = CLOSE;
    local_98.ncalls = 0;
    puStack_140 = (uv_loop_t *)0x1bd287;
    uv_signal_start(&local_98.handle,signal_cb,0x11);
    puStack_140 = (uv_loop_t *)0x1bd299;
    start_timer(puVar4,0x11,&local_120);
    puStack_140 = (uv_loop_t *)0x1bd2a3;
    iVar3 = uv_run(puVar4,0);
    local_128 = (ulong)iVar3;
    local_130 = 0;
    if (local_128 != 0) goto LAB_001bd3b5;
    local_128 = (ulong)local_120.ncalls;
    local_130 = 10;
    if (local_128 != 10) goto LAB_001bd3c4;
    local_128 = (ulong)local_98.ncalls;
    local_130 = 10;
    if (local_128 != 10) goto LAB_001bd3d3;
    puStack_140 = (uv_loop_t *)0x1bd317;
    uv_walk(puVar4,close_walk_cb,0);
    puStack_140 = (uv_loop_t *)0x1bd321;
    uv_run(puVar4,0);
    local_128 = 0;
    puStack_140 = (uv_loop_t *)0x1bd332;
    iVar3 = uv_loop_close(puVar4);
    local_130 = (ulong)iVar3;
    if (local_128 == local_130) {
      puStack_140 = (uv_loop_t *)0x1bd34e;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_140 = (uv_loop_t *)0x1bd36a;
    run_test_we_get_signal_cold_1();
LAB_001bd36a:
    puStack_140 = (uv_loop_t *)0x1bd379;
    run_test_we_get_signal_cold_2();
LAB_001bd379:
    puStack_140 = (uv_loop_t *)0x1bd388;
    run_test_we_get_signal_cold_3();
LAB_001bd388:
    puStack_140 = (uv_loop_t *)0x1bd397;
    run_test_we_get_signal_cold_4();
LAB_001bd397:
    puStack_140 = (uv_loop_t *)0x1bd3a6;
    run_test_we_get_signal_cold_5();
LAB_001bd3a6:
    puStack_140 = (uv_loop_t *)0x1bd3b5;
    run_test_we_get_signal_cold_6();
LAB_001bd3b5:
    puStack_140 = (uv_loop_t *)0x1bd3c4;
    run_test_we_get_signal_cold_7();
LAB_001bd3c4:
    puStack_140 = (uv_loop_t *)0x1bd3d3;
    run_test_we_get_signal_cold_8();
LAB_001bd3d3:
    puStack_140 = (uv_loop_t *)0x1bd3e2;
    run_test_we_get_signal_cold_9();
  }
  uVar8 = SUB84(&local_130,0);
  puStack_140 = (uv_loop_t *)start_timer;
  run_test_we_get_signal_cold_10();
  puVar9 = &uStack_150;
  *extraout_RDX = 0;
  extraout_RDX[0x20] = uVar8;
  puStack_140 = puVar4;
  iVar3 = uv_timer_init();
  lStack_148 = (long)iVar3;
  uStack_150 = 0;
  if (lStack_148 == 0) {
    iVar6 = 5;
    iVar3 = uv_timer_start(extraout_RDX + 2,timer_cb,5);
    lStack_148 = (long)iVar3;
    uStack_150 = 0;
    if (lStack_148 == 0) {
      return iVar3;
    }
  }
  else {
    start_timer_cold_1();
  }
  start_timer_cold_2();
  uVar7 = (ulong)puVar9 & 0xffffffff;
  *(int *)(extraout_RDX_00 + 0x10) = (int)puVar9;
  *extraout_RDX_00 = 0;
  *(int *)((long)extraout_RDX_00 + 0x84) = iVar6;
  puVar9 = extraout_RDX_00 + 1;
  pcStack_190 = (code *)0x1bd4ad;
  puStack_170 = extraout_RDX + 2;
  psStack_168 = ctx;
  iVar3 = uv_signal_init();
  lStack_178 = (long)iVar3;
  uStack_180 = 0;
  if (lStack_178 == 0) {
    lVar5 = 0;
    if (iVar6 != 0) {
      pcStack_190 = (code *)0x1bd4da;
      iVar3 = uv_signal_start_oneshot(puVar9,signal_cb_one_shot,uVar7);
      lStack_178 = (long)iVar3;
      uStack_180 = 0;
      if (lStack_178 == 0) {
        return iVar3;
      }
      pcStack_190 = (code *)0x1bd505;
      start_watcher_cold_2();
      lVar5 = lStack_178;
    }
    lStack_178 = lVar5;
    pcStack_190 = (code *)0x1bd516;
    iVar3 = uv_signal_start(puVar9,signal_cb,uVar7);
    lStack_178 = (long)iVar3;
    uStack_180 = 0;
    if (lStack_178 == 0) {
      return iVar3;
    }
  }
  else {
    pcStack_190 = (code *)0x1bd54c;
    start_watcher_cold_1();
  }
  plVar10 = &lStack_178;
  iVar3 = (int)&uStack_180;
  pcStack_190 = signal_cb;
  start_watcher_cold_3();
  pcStack_190 = (code *)(long)iVar3;
  lStack_198 = (long)(int)plVar10[0xf];
  if (pcStack_190 == (code *)lStack_198) {
    iVar3 = *(int *)((long)plVar10 + -4) + 1;
    *(int *)((long)plVar10 + -4) = iVar3;
    if (iVar3 != 10) {
      return iVar3;
    }
    if ((int)plVar10[-1] == 0) {
      iVar3 = uv_close();
      return iVar3;
    }
    if ((int)plVar10[-1] == 1) {
      iVar3 = uv_signal_stop();
      return iVar3;
    }
  }
  else {
    pcStack_1a8 = (code *)0x1bd5bd;
    signal_cb_cold_1();
  }
  pcStack_1a8 = run_test_we_get_signals;
  signal_cb_cold_2();
  pcStack_1a8 = (code *)0x0;
  ptStack_500 = (timer_ctx *)0x1bd5d3;
  uStack_1b8 = uVar7;
  puStack_1b0 = puVar9;
  puVar4 = (uv_loop_t *)uv_default_loop();
  ptStack_500 = (timer_ctx *)0x1bd5ed;
  start_watcher(puVar4,10,&sStack_4e8,0);
  ptStack_500 = (timer_ctx *)0x1bd608;
  start_watcher(puVar4,10,&sStack_460,0);
  ptStack_500 = (timer_ctx *)0x1bd61f;
  start_watcher(puVar4,0xc,&sStack_3d8,0);
  ptStack_500 = (timer_ctx *)0x1bd636;
  start_watcher(puVar4,0xc,&sStack_350,0);
  ptStack_500 = (timer_ctx *)0x1bd64e;
  start_timer(puVar4,10,&tStack_2c8);
  ptStack_500 = (timer_ctx *)0x1bd661;
  start_timer(puVar4,0xc,&tStack_240);
  ptStack_500 = (timer_ctx *)0x1bd66b;
  iVar3 = uv_run(puVar4,0);
  uStack_4f0 = (ulong)iVar3;
  uStack_4f8 = 0;
  if (uStack_4f0 != 0) goto LAB_001bd750;
  lVar5 = 4;
  do {
    uStack_4f0 = (ulong)*(uint *)((long)&sStack_4e8.stop_or_close + lVar5);
    uStack_4f8 = 10;
    if (uStack_4f0 != 10) {
      ptStack_500 = (timer_ctx *)0x1bd743;
      run_test_we_get_signals_cold_2();
      goto LAB_001bd743;
    }
    lVar5 = lVar5 + 0x88;
  } while (lVar5 != 0x224);
  ptVar12 = &tStack_2c8;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uStack_4f0 = (ulong)ptVar12->ncalls;
    uStack_4f8 = 10;
    if (uStack_4f0 != 10) goto LAB_001bd743;
    ptVar12 = &tStack_240;
    bVar1 = false;
  } while (bVar2);
  ptStack_500 = (timer_ctx *)0x1bd6f6;
  uv_walk(puVar4,close_walk_cb,0);
  ptStack_500 = (timer_ctx *)0x1bd700;
  uv_run(puVar4,0);
  uStack_4f0 = 0;
  ptStack_500 = (timer_ctx *)0x1bd711;
  iVar3 = uv_loop_close(puVar4);
  uStack_4f8 = (ulong)iVar3;
  if (uStack_4f0 == uStack_4f8) {
    ptStack_500 = (timer_ctx *)0x1bd727;
    uv_library_shutdown();
    return 0;
  }
  goto LAB_001bd75d;
LAB_001bd743:
  ptStack_500 = (timer_ctx *)0x1bd750;
  run_test_we_get_signals_cold_3();
LAB_001bd750:
  ptStack_500 = (timer_ctx *)0x1bd75d;
  run_test_we_get_signals_cold_1();
LAB_001bd75d:
  ptStack_500 = (timer_ctx *)run_test_we_get_signal_one_shot;
  run_test_we_get_signals_cold_4();
  puStack_508 = puVar4;
  ptStack_500 = &tStack_240;
  puVar4 = (uv_loop_t *)uv_default_loop();
  start_timer(puVar4,0x11,&tStack_618);
  start_watcher(puVar4,0x11,&sStack_590,1);
  sStack_590.stop_or_close = NOOP;
  iVar3 = uv_run(puVar4,0);
  uStack_620 = (ulong)iVar3;
  uStack_628 = 0;
  if (uStack_620 == 0) {
    uStack_620 = (ulong)tStack_618.ncalls;
    uStack_628 = 10;
    if (uStack_620 != 10) goto LAB_001bd987;
    uStack_620 = 1;
    uStack_628 = (ulong)sStack_590.ncalls;
    if (uStack_628 != 1) goto LAB_001bd996;
    start_timer(puVar4,0x11,&tStack_618);
    iVar3 = uv_run(puVar4,0);
    uStack_620 = (ulong)iVar3;
    uStack_628 = 0;
    if (uStack_620 != 0) goto LAB_001bd9a5;
    uStack_620 = 1;
    uStack_628 = (ulong)sStack_590.ncalls;
    if (uStack_628 != 1) goto LAB_001bd9b4;
    sStack_590.stop_or_close = CLOSE;
    sStack_590.ncalls = 0;
    uv_signal_start_oneshot(&sStack_590.handle,signal_cb_one_shot,0x11);
    start_timer(puVar4,0x11,&tStack_618);
    iVar3 = uv_run(puVar4,0);
    uStack_620 = (ulong)iVar3;
    uStack_628 = 0;
    if (uStack_620 != 0) goto LAB_001bd9c3;
    uStack_620 = (ulong)tStack_618.ncalls;
    uStack_628 = 10;
    if (uStack_620 != 10) goto LAB_001bd9d2;
    uStack_620 = 1;
    uStack_628 = (ulong)sStack_590.ncalls;
    if (uStack_628 != 1) goto LAB_001bd9e1;
    uv_walk(puVar4,close_walk_cb,0);
    uv_run(puVar4,0);
    uStack_620 = 0;
    iVar3 = uv_loop_close(puVar4);
    uStack_628 = (ulong)iVar3;
    if (uStack_620 == uStack_628) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_001bd987:
    run_test_we_get_signal_one_shot_cold_2();
LAB_001bd996:
    run_test_we_get_signal_one_shot_cold_3();
LAB_001bd9a5:
    run_test_we_get_signal_one_shot_cold_4();
LAB_001bd9b4:
    run_test_we_get_signal_one_shot_cold_5();
LAB_001bd9c3:
    run_test_we_get_signal_one_shot_cold_6();
LAB_001bd9d2:
    run_test_we_get_signal_one_shot_cold_7();
LAB_001bd9e1:
    run_test_we_get_signal_one_shot_cold_8();
  }
  puVar11 = &uStack_620;
  iVar3 = (int)&uStack_628;
  run_test_we_get_signal_one_shot_cold_9();
  if (iVar3 == (int)puVar11[0xf]) {
    iVar3 = *(int *)((long)puVar11 + -4) + 1;
    *(int *)((long)puVar11 + -4) = iVar3;
    if (iVar3 == 1) {
      if ((int)puVar11[-1] != 0) {
        return 1;
      }
      iVar3 = uv_close();
      return iVar3;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_678 = puVar4;
  puVar4 = (uv_loop_t *)uv_default_loop();
  start_timer(puVar4,0x11,&tStack_928);
  start_watcher(puVar4,0x11,&sStack_8a0,1);
  start_watcher(puVar4,0x11,&sStack_818,1);
  sStack_8a0.stop_or_close = CLOSE;
  sStack_818.stop_or_close = CLOSE;
  iVar3 = uv_run(puVar4,0);
  uStack_930 = (ulong)iVar3;
  if (uStack_930 == 0) {
    uStack_930 = (ulong)tStack_928.ncalls;
    if (uStack_930 != 10) goto LAB_001be11f;
    uStack_930 = 1;
    if (sStack_8a0.ncalls != 1) goto LAB_001be12e;
    uStack_930 = 1;
    if (sStack_818.ncalls != 1) goto LAB_001be13d;
    start_timer(puVar4,0x11,&tStack_928);
    start_watcher(puVar4,0x11,&sStack_8a0,1);
    start_watcher(puVar4,0x11,&sStack_818,1);
    sStack_8a0.stop_or_close = CLOSE;
    sStack_818.stop_or_close = CLOSE;
    start_watcher(puVar4,0x11,&sStack_790,0);
    uv_close(&sStack_790.handle,0);
    iVar3 = uv_run(puVar4,0);
    uStack_930 = (ulong)iVar3;
    if (uStack_930 != 0) goto LAB_001be14c;
    uStack_930 = (ulong)tStack_928.ncalls;
    if (uStack_930 != 10) goto LAB_001be15b;
    uStack_930 = 1;
    if (sStack_8a0.ncalls != 1) goto LAB_001be16a;
    uStack_930 = 1;
    if (sStack_818.ncalls != 1) goto LAB_001be179;
    uStack_930 = (ulong)sStack_790.ncalls;
    if (uStack_930 != 0) goto LAB_001be188;
    start_timer(puVar4,0x11,&tStack_928);
    start_watcher(puVar4,0x11,&sStack_8a0,0);
    start_watcher(puVar4,0x11,&sStack_818,0);
    sStack_8a0.stop_or_close = CLOSE;
    sStack_818.stop_or_close = CLOSE;
    start_watcher(puVar4,0x11,&sStack_790,1);
    uv_close(&sStack_790.handle,0);
    iVar3 = uv_run(puVar4,0);
    uStack_930 = (ulong)iVar3;
    if (uStack_930 != 0) goto LAB_001be197;
    uStack_930 = (ulong)tStack_928.ncalls;
    if (uStack_930 != 10) goto LAB_001be1a6;
    uStack_930 = (ulong)sStack_8a0.ncalls;
    if (uStack_930 != 10) goto LAB_001be1b5;
    uStack_930 = (ulong)sStack_818.ncalls;
    if (uStack_930 != 10) goto LAB_001be1c4;
    uStack_930 = (ulong)sStack_790.ncalls;
    if (uStack_930 != 0) goto LAB_001be1d3;
    start_timer(puVar4,0x11,&tStack_928);
    start_watcher(puVar4,0x11,&sStack_8a0,0);
    start_watcher(puVar4,0x11,&sStack_818,0);
    start_watcher(puVar4,0x11,&sStack_790,1);
    start_watcher(puVar4,0x11,&sStack_708,1);
    sStack_790.stop_or_close = CLOSE;
    sStack_708.stop_or_close = CLOSE;
    uv_close(&sStack_8a0.handle,0);
    uv_close(&sStack_818.handle,0);
    iVar3 = uv_run(puVar4,0);
    uStack_930 = (ulong)iVar3;
    if (uStack_930 != 0) goto LAB_001be1e2;
    uStack_930 = (ulong)tStack_928.ncalls;
    if (uStack_930 != 10) goto LAB_001be1f1;
    uStack_930 = (ulong)sStack_8a0.ncalls;
    if (uStack_930 != 0) goto LAB_001be200;
    uStack_930 = (ulong)sStack_818.ncalls;
    if (uStack_930 != 0) goto LAB_001be20f;
    uStack_930 = 1;
    if (sStack_790.ncalls != 1) goto LAB_001be21e;
    uStack_930 = 1;
    start_timer(puVar4,0x11,&tStack_928);
    start_watcher(puVar4,0x11,&sStack_8a0,0);
    start_watcher(puVar4,0x11,&sStack_818,1);
    start_watcher(puVar4,0x11,&sStack_790,0);
    start_watcher(puVar4,0x11,&sStack_708,0);
    sStack_708.stop_or_close = CLOSE;
    uv_close(&sStack_8a0.handle,0);
    uv_close(&sStack_790.handle,0);
    iVar3 = uv_run(puVar4,0);
    uStack_930 = (ulong)iVar3;
    if (uStack_930 != 0) goto LAB_001be23c;
    uStack_930 = (ulong)tStack_928.ncalls;
    if (uStack_930 != 10) goto LAB_001be24b;
    uStack_930 = (ulong)sStack_8a0.ncalls;
    if (uStack_930 != 0) goto LAB_001be25a;
    uStack_930 = 1;
    if (sStack_818.ncalls != 1) goto LAB_001be269;
    uStack_930 = (ulong)sStack_790.ncalls;
    if (uStack_930 != 0) goto LAB_001be278;
    uStack_930 = (ulong)sStack_708.ncalls;
    if (uStack_930 == 10) {
      uv_walk(puVar4,close_walk_cb,0);
      uv_run(puVar4,0);
      uStack_930 = 0;
      iVar3 = uv_loop_close(puVar4);
      if (uStack_930 == (long)iVar3) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001be296;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001be11f:
    run_test_we_get_signals_mixed_cold_2();
LAB_001be12e:
    run_test_we_get_signals_mixed_cold_3();
LAB_001be13d:
    run_test_we_get_signals_mixed_cold_4();
LAB_001be14c:
    run_test_we_get_signals_mixed_cold_5();
LAB_001be15b:
    run_test_we_get_signals_mixed_cold_6();
LAB_001be16a:
    run_test_we_get_signals_mixed_cold_7();
LAB_001be179:
    run_test_we_get_signals_mixed_cold_8();
LAB_001be188:
    run_test_we_get_signals_mixed_cold_9();
LAB_001be197:
    run_test_we_get_signals_mixed_cold_10();
LAB_001be1a6:
    run_test_we_get_signals_mixed_cold_11();
LAB_001be1b5:
    run_test_we_get_signals_mixed_cold_12();
LAB_001be1c4:
    run_test_we_get_signals_mixed_cold_13();
LAB_001be1d3:
    run_test_we_get_signals_mixed_cold_14();
LAB_001be1e2:
    run_test_we_get_signals_mixed_cold_15();
LAB_001be1f1:
    run_test_we_get_signals_mixed_cold_16();
LAB_001be200:
    run_test_we_get_signals_mixed_cold_17();
LAB_001be20f:
    run_test_we_get_signals_mixed_cold_18();
LAB_001be21e:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001be23c:
    run_test_we_get_signals_mixed_cold_21();
LAB_001be24b:
    run_test_we_get_signals_mixed_cold_22();
LAB_001be25a:
    run_test_we_get_signals_mixed_cold_23();
LAB_001be269:
    run_test_we_get_signals_mixed_cold_24();
LAB_001be278:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001be296:
  puVar11 = &uStack_930;
  run_test_we_get_signals_mixed_cold_27();
  iVar3 = uv_is_closing();
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = uv_close(puVar11,0);
  return iVar3;
}

Assistant:

TEST_IMPL(we_get_signal) {
  struct signal_ctx sc;
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, &sc, 0);
  sc.stop_or_close = STOP; /* stop, don't close the signal handle */
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc.ncalls, NSIGNALS);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc.ncalls, NSIGNALS);

  sc.ncalls = 0;
  sc.stop_or_close = CLOSE; /* now close it when it's done */
  uv_signal_start(&sc.handle, signal_cb, SIGCHLD);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc.ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}